

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr
deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsLoadStoreTES>(void)

{
  BasicAllTargetsLoadStoreTES *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (BasicAllTargetsLoadStoreTES *)operator_new(0x30);
  (this->super_LoadStoreMachine).super_ShaderImageLoadStoreBase.super_SubcaseBase.super_GLWrapper.
  m_context = (Context *)0x0;
  (this->super_LoadStoreMachine).m_vao = 0;
  (this->super_LoadStoreMachine).m_stage = 0;
  (this->super_LoadStoreMachine).super_ShaderImageLoadStoreBase.super_SubcaseBase.super_GLWrapper.
  super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_LoadStoreMachine).super_ShaderImageLoadStoreBase.super_SubcaseBase.super_GLWrapper.
    super_CallLogWrapper.m_enableLog = 0;
  (this->super_LoadStoreMachine).super_ShaderImageLoadStoreBase.super_SubcaseBase.super_GLWrapper.
  _vptr_GLWrapper = (_func_int **)0x0;
  (this->super_LoadStoreMachine).super_ShaderImageLoadStoreBase.super_SubcaseBase.super_GLWrapper.
  super_CallLogWrapper.m_gl = (Functions *)0x0;
  gl4cts::anon_unknown_0::BasicAllTargetsLoadStoreTES::BasicAllTargetsLoadStoreTES(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}